

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O0

char * google::protobuf::internal::TcParser::FastV8S1
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  TcParseTableBase *pTVar1;
  ParseContext *pPVar2;
  uint64_t uVar3;
  ParseContext *p;
  MessageLite *x;
  byte bVar4;
  bool bVar5;
  uint16_t uVar6;
  unsigned_short uVar7;
  uint uVar8;
  uint *puVar9;
  ulong uVar10;
  TailCallParseFunc UNRECOVERED_JUMPTABLE;
  char *pcVar11;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_160 [2];
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_150;
  byte local_141;
  bool *pbStack_140;
  uint8_t value;
  bool *field;
  uint64_t uStack_130;
  unsigned_short coded_tag;
  uint64_t hasbits_local;
  TcParseTableBase *table_local;
  ParseContext *ctx_local;
  char *ptr_local;
  MessageLite *msg_local;
  TcFieldData data_local;
  TcFieldData local_f8;
  TcFieldData local_f0;
  undefined1 local_e1;
  ulong uStack_e0;
  bool always_return;
  TcParseTableBase *local_d8;
  ParseContext *local_d0;
  ParseContext *local_c8;
  MessageLite *local_c0;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_b8;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_b0;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_a8;
  TcFieldData data_1;
  FastFieldEntry *fast_entry;
  size_t idx;
  unsigned_short coded_tag_1;
  uint32_t has_bits_offset;
  
  uStack_130 = hasbits;
  hasbits_local = (uint64_t)table;
  table_local = (TcParseTableBase *)ctx;
  ctx_local = (ParseContext *)ptr;
  ptr_local = (char *)msg;
  msg_local = (MessageLite *)data.field_0;
  field._6_2_ = TcFieldData::coded_tag<unsigned_short>((TcFieldData *)&msg_local);
  pcVar11 = ptr_local;
  pPVar2 = ctx_local;
  pTVar1 = table_local;
  if (field._6_2_ != 0 && field._6_2_ != 0x100) {
    TcFieldData::TcFieldData((TcFieldData *)local_160);
    pcVar11 = MiniParse((MessageLite *)pcVar11,(char *)pPVar2,(ParseContext *)pTVar1,
                        (TcFieldData)local_160[0],(TcParseTableBase *)hasbits_local,uStack_130);
    return pcVar11;
  }
  uVar6 = TcFieldData::offset((TcFieldData *)&msg_local);
  pbStack_140 = RefAt<bool>(pcVar11,(ulong)uVar6);
  local_141 = (byte)((ulong)msg_local >> 8);
  if (1 < local_141) {
    protobuf_assumption_failed
              ("value <= 1",
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
               ,0x3ca);
  }
  *pbStack_140 = local_141 != 0;
  ctx_local = (ParseContext *)((long)&(ctx_local->super_EpsCopyInputStream).limit_end_ + 2);
  bVar4 = TcFieldData::hasbit_idx((TcFieldData *)&msg_local);
  pcVar11 = ptr_local;
  pPVar2 = ctx_local;
  pTVar1 = table_local;
  uStack_130 = 1L << (bVar4 & 0x3f) | uStack_130;
  TcFieldData::TcFieldData((TcFieldData *)&local_150);
  local_b8 = local_150;
  local_c0 = (MessageLite *)pcVar11;
  local_c8 = pPVar2;
  local_d0 = (ParseContext *)pTVar1;
  local_d8 = (TcParseTableBase *)hasbits_local;
  uStack_e0 = uStack_130;
  local_e1 = 0;
  bVar5 = EpsCopyInputStream::DataAvailable((EpsCopyInputStream *)pTVar1,(char *)pPVar2);
  x = local_c0;
  p = local_c8;
  pPVar2 = local_d0;
  if (!bVar5) {
    TcFieldData::TcFieldData(&local_f0);
    if (local_d8->has_bits_offset != 0) {
      uVar8 = (uint)uStack_e0;
      puVar9 = RefAt<unsigned_int>(x,(ulong)(uint)local_d8->has_bits_offset);
      *puVar9 = uVar8 | *puVar9;
    }
    return (char *)p;
  }
  TcFieldData::TcFieldData(&local_f8);
  pTVar1 = local_d8;
  uVar3 = uStack_e0;
  uVar7 = UnalignedLoad<unsigned_short>((char *)p);
  uVar10 = (ulong)(int)((uint)uVar7 & (uint)pTVar1->fast_idx_mask);
  if ((uVar10 & 7) != 0) {
    protobuf_assumption_failed
              ("(idx & 7) == 0",
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
               ,0x452);
  }
  data_1.field_0 =
       (anon_union_8_1_898a9ca8_for_TcFieldData_0)TcParseTableBase::fast_entry(pTVar1,uVar10 >> 3);
  local_a8.data =
       ((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)((long)data_1.field_0 + 8))->data ^
       (ulong)uVar7;
  UNRECOVERED_JUMPTABLE = TcParseTableBase::FastFieldEntry::target((FastFieldEntry *)data_1.field_0)
  ;
  local_b0.data = local_a8.data;
  pcVar11 = (*UNRECOVERED_JUMPTABLE)(x,(char *)p,pPVar2,(TcFieldData)local_a8,pTVar1,uVar3);
  return pcVar11;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastV8S1(PROTOBUF_TC_PARAM_DECL) {
  using TagType = uint8_t;

  // Special case for a varint bool field with a tag of 1 byte:
  // The coded_tag() field will actually contain the value too and we can check
  // both at the same time.
  auto coded_tag = data.coded_tag<uint16_t>();
  if (ABSL_PREDICT_TRUE(coded_tag == 0x0000 || coded_tag == 0x0100)) {
    auto& field = RefAt<bool>(msg, data.offset());
    // Note: we use `data.data` because Clang generates suboptimal code when
    // using coded_tag.
    // In x86_64 this uses the CH register to read the second byte out of
    // `data`.
    uint8_t value = data.data >> 8;
    // The assume allows using a mov instead of test+setne.
    PROTOBUF_ASSUME(value <= 1);
    field = static_cast<bool>(value);

    ptr += sizeof(TagType) + 1;  // Consume the tag and the value.
    hasbits |= (uint64_t{1} << data.hasbit_idx());

    PROTOBUF_MUSTTAIL return ToTagDispatch(PROTOBUF_TC_PARAM_NO_DATA_PASS);
  }

  // If it didn't match above either the tag is wrong, or the value is encoded
  // non-canonically.
  // Jump to MiniParse as wrong tag is the most probable reason.
  PROTOBUF_MUSTTAIL return MiniParse(PROTOBUF_TC_PARAM_NO_DATA_PASS);
}